

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

void __thiscall Am_Connection::Receive_Object(Am_Connection *this,Am_Object *the_obj)

{
  Am_Connection_Data *pAVar1;
  Am_Receive_Method_Type *pAVar2;
  Am_Slot_Key key;
  bool bVar3;
  Am_Value *pAVar4;
  Am_Wrapper *value;
  incomplete_obj_node **ppiVar5;
  incomplete_obj_node *unaff_R14;
  incomplete_obj_node *piVar6;
  Am_Assoc blessing;
  Am_Value local_58;
  Am_Value local_48;
  Am_Value_List slot_list;
  
  ppiVar5 = &this->data->Object_Queue;
  do {
    piVar6 = unaff_R14;
    unaff_R14 = *ppiVar5;
    if (unaff_R14 == (incomplete_obj_node *)0x0) {
      unaff_R14 = (incomplete_obj_node *)operator_new(0x38);
      incomplete_obj_node::incomplete_obj_node(unaff_R14);
      goto LAB_001cdfc0;
    }
    bVar3 = Am_Object::operator!=(&unaff_R14->obj,the_obj);
    ppiVar5 = &unaff_R14->next;
  } while (bVar3);
  piVar6->next = *ppiVar5;
LAB_001cdfc0:
  Am_Object::operator=(&unaff_R14->obj,the_obj);
  pAVar4 = Am_Object::Get(the_obj,0xb8,0);
  Am_Value_List::Am_Value_List(&slot_list,pAVar4);
  local_58.type = 9;
  local_58.value = (anon_union_8_8_ea4c8939_for_value)this;
  local_48.value._0_2_ = Am_Value_List::Length(&slot_list);
  local_48.type = 2;
  local_48.value.long_value._2_6_ = 0;
  Am_Assoc::Am_Assoc(&blessing,&local_58,&local_48);
  Am_Value::~Am_Value(&local_48);
  Am_Value::~Am_Value(&local_58);
  key = Am_NET_BLESSING;
  value = Am_Assoc::operator_cast_to_Am_Wrapper_(&blessing);
  Am_Object::Set(&unaff_R14->obj,key,value,0);
  unaff_R14->bogus = true;
  pAVar4 = Am_Object::Get(the_obj,0xb8,0);
  Am_Value_List::operator=(&unaff_R14->slot_list,pAVar4);
  pAVar2 = (this->data->my_receiver).Call;
  (unaff_R14->prev_receiver).from_wrapper = (this->data->my_receiver).from_wrapper;
  (unaff_R14->prev_receiver).Call = pAVar2;
  pAVar2 = receive_obj.Call;
  pAVar1 = this->data;
  (pAVar1->my_receiver).from_wrapper = receive_obj.from_wrapper;
  (pAVar1->my_receiver).Call = pAVar2;
  pAVar1 = this->data;
  unaff_R14->next = pAVar1->Object_Queue;
  pAVar1->Object_Queue = unaff_R14;
  Am_Assoc::~Am_Assoc(&blessing);
  Am_Value_List::~Am_Value_List(&slot_list);
  return;
}

Assistant:

void
Am_Connection::Receive_Object(Am_Object &the_obj)
{
  //
  //This implements a "latest received" policy.
  //It enforces that there will only be one copy of an object being
  // built at a time.
  //
  Incomplete_Object_Ptr new_partial_obj_ptr, prev_ptr;
  new_partial_obj_ptr = data->Object_Queue;
  while ((new_partial_obj_ptr != nullptr) &&
         (new_partial_obj_ptr->obj != the_obj)) {
    prev_ptr = new_partial_obj_ptr;
    new_partial_obj_ptr = new_partial_obj_ptr->next;
  }
  if (new_partial_obj_ptr == nullptr)
    new_partial_obj_ptr = new Incomplete_Object_Type;
  else
    //Move this object to the head of the list and restart
    //building it from scratch.
    prev_ptr->next = new_partial_obj_ptr->next;

  //Risk: If objects come in fast and the demons
  // do not fire soon after an object is received...
  // Might need to maintain multiple object states to ensure integrity
  // During simultaneous Send and Receives.
  new_partial_obj_ptr->obj = the_obj;
  // Declaw demon during receive
  Am_Value_List slot_list = the_obj.Get(Am_SLOTS_TO_SAVE);
  Am_Assoc blessing((Am_Ptr)this, (slot_list.Length()));
  new_partial_obj_ptr->obj.Set(Am_NET_BLESSING, blessing);

  new_partial_obj_ptr->bogus = true;
  new_partial_obj_ptr->slot_list = the_obj.Get(Am_SLOTS_TO_SAVE);

  new_partial_obj_ptr->prev_receiver = data->my_receiver;
  data->my_receiver = receive_obj;

  new_partial_obj_ptr->next = data->Object_Queue;
  data->Object_Queue = new_partial_obj_ptr;
}